

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  byte bVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  float fVar67;
  undefined1 auVar68 [32];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [64];
  undefined1 auVar73 [32];
  uint uVar75;
  uint uVar76;
  undefined1 auVar74 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined4 uVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2880 [16];
  Geometry *local_2868;
  ulong local_2860;
  ulong local_2858;
  long local_2850;
  undefined1 (*local_2848) [16];
  long local_2840;
  ulong local_2838;
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar34;
  
  pauVar43 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar90 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = fVar2;
  local_23e0._0_4_ = fVar2;
  local_23e0._8_4_ = fVar2;
  local_23e0._12_4_ = fVar2;
  local_23e0._16_4_ = fVar2;
  local_23e0._20_4_ = fVar2;
  local_23e0._24_4_ = fVar2;
  local_23e0._28_4_ = fVar2;
  auVar66 = ZEXT3264(local_23e0);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = fVar67;
  local_2400._0_4_ = fVar67;
  local_2400._8_4_ = fVar67;
  local_2400._12_4_ = fVar67;
  local_2400._16_4_ = fVar67;
  local_2400._20_4_ = fVar67;
  local_2400._24_4_ = fVar67;
  local_2400._28_4_ = fVar67;
  auVar69 = ZEXT3264(local_2400);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar67 = fVar67 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2858 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2838 = local_2858 ^ 0x20;
  iVar31 = (tray->tfar).field_0.i[k];
  auVar48 = ZEXT3264(CONCAT428(iVar31,CONCAT424(iVar31,CONCAT420(iVar31,CONCAT416(iVar31,CONCAT412(
                                                  iVar31,CONCAT48(iVar31,CONCAT44(iVar31,iVar31)))))
                                               )));
  local_2420._8_4_ = 0x80000000;
  local_2420._0_8_ = 0x8000000080000000;
  local_2420._12_4_ = 0x80000000;
  local_2420._16_4_ = 0x80000000;
  local_2420._20_4_ = 0x80000000;
  local_2420._24_4_ = 0x80000000;
  local_2420._28_4_ = 0x80000000;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar74 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar79 = ZEXT3264(local_2460);
  iVar31 = (tray->tnear).field_0.i[k];
  local_2480._4_4_ = iVar31;
  local_2480._0_4_ = iVar31;
  local_2480._8_4_ = iVar31;
  local_2480._12_4_ = iVar31;
  local_2480._16_4_ = iVar31;
  local_2480._20_4_ = iVar31;
  local_2480._24_4_ = iVar31;
  local_2480._28_4_ = iVar31;
  auVar81 = ZEXT3264(local_2480);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_24a0._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
  local_24a0._8_4_ = -fVar67;
  local_24a0._12_4_ = -fVar67;
  local_24a0._16_4_ = -fVar67;
  local_24a0._20_4_ = -fVar67;
  local_24a0._24_4_ = -fVar67;
  local_24a0._28_4_ = -fVar67;
  auVar84 = ZEXT3264(local_24a0);
  local_2848 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar65._8_4_ = 0xbf800000;
  auVar65._0_8_ = 0xbf800000bf800000;
  auVar65._12_4_ = 0xbf800000;
  auVar65._16_4_ = 0xbf800000;
  auVar65._20_4_ = 0xbf800000;
  auVar65._24_4_ = 0xbf800000;
  auVar65._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar57,auVar65,local_24c0);
LAB_016719f0:
  do {
    do {
      if (pauVar43 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar36 = pauVar43 + -1;
      pauVar43 = pauVar43 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar36 + 8));
    uVar37 = *(ulong *)*pauVar43;
    while ((uVar37 & 8) == 0) {
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + local_2858),auVar74._0_32_,
                                auVar90._0_32_);
      auVar53 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar41),auVar79._0_32_,
                                auVar66._0_32_);
      auVar65 = vpmaxsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar53));
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar42),auVar84._0_32_,
                                auVar69._0_32_);
      auVar57 = vpmaxsd_avx2(ZEXT1632(auVar49),auVar81._0_32_);
      local_2700 = vpmaxsd_avx2(auVar65,auVar57);
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + local_2838),auVar74._0_32_,
                                auVar90._0_32_);
      auVar53 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar41 ^ 0x20)),
                                auVar79._0_32_,auVar66._0_32_);
      auVar65 = vpminsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar53));
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar42 ^ 0x20)),
                                auVar84._0_32_,auVar69._0_32_);
      auVar57 = vpminsd_avx2(ZEXT1632(auVar49),auVar48._0_32_);
      auVar65 = vpminsd_avx2(auVar65,auVar57);
      auVar65 = vpcmpgtd_avx2(local_2700,auVar65);
      iVar31 = vmovmskps_avx(auVar65);
      if (iVar31 == 0xff) goto LAB_016719f0;
      bVar30 = ~(byte)iVar31;
      uVar39 = uVar37 & 0xfffffffffffffff0;
      lVar38 = 0;
      for (uVar37 = (ulong)bVar30; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar37 = *(ulong *)(uVar39 + lVar38 * 8);
      uVar32 = bVar30 - 1 & (uint)bVar30;
      uVar34 = (ulong)uVar32;
      if (uVar32 != 0) {
        uVar33 = *(uint *)(local_2700 + lVar38 * 4);
        lVar38 = 0;
        for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar32 = uVar32 - 1 & uVar32;
        uVar35 = (ulong)uVar32;
        uVar34 = *(ulong *)(uVar39 + lVar38 * 8);
        uVar75 = *(uint *)(local_2700 + lVar38 * 4);
        if (uVar32 == 0) {
          if (uVar33 < uVar75) {
            *(ulong *)*pauVar43 = uVar34;
            *(uint *)(*pauVar43 + 8) = uVar75;
            pauVar43 = pauVar43 + 1;
          }
          else {
            *(ulong *)*pauVar43 = uVar37;
            *(uint *)(*pauVar43 + 8) = uVar33;
            uVar37 = uVar34;
            pauVar43 = pauVar43 + 1;
          }
        }
        else {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar37;
          auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar33));
          auVar53._8_8_ = 0;
          auVar53._0_8_ = uVar34;
          auVar53 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar75));
          lVar38 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar37 = (ulong)uVar32;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(uVar39 + lVar38 * 8);
          auVar50 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_2700 + lVar38 * 4)));
          auVar56 = vpcmpgtd_avx(auVar53,auVar49);
          if (uVar32 == 0) {
            auVar61 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar53,auVar49,auVar61);
            auVar49 = vblendvps_avx(auVar49,auVar53,auVar61);
            auVar53 = vpcmpgtd_avx(auVar50,auVar56);
            auVar61 = vpshufd_avx(auVar53,0xaa);
            auVar53 = vblendvps_avx(auVar50,auVar56,auVar61);
            auVar56 = vblendvps_avx(auVar56,auVar50,auVar61);
            auVar50 = vpcmpgtd_avx(auVar56,auVar49);
            auVar61 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar56,auVar49,auVar61);
            auVar49 = vblendvps_avx(auVar49,auVar56,auVar61);
            *pauVar43 = auVar49;
            pauVar43[1] = auVar50;
            uVar37 = auVar53._0_8_;
            pauVar43 = pauVar43 + 2;
          }
          else {
            lVar38 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            uVar32 = uVar32 - 1 & uVar32;
            uVar37 = (ulong)uVar32;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(uVar39 + lVar38 * 8);
            auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_2700 + lVar38 * 4)));
            if (uVar32 == 0) {
              auVar44 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar53,auVar49,auVar44);
              auVar49 = vblendvps_avx(auVar49,auVar53,auVar44);
              auVar53 = vpcmpgtd_avx(auVar61,auVar50);
              auVar44 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar61,auVar50,auVar44);
              auVar50 = vblendvps_avx(auVar50,auVar61,auVar44);
              auVar61 = vpcmpgtd_avx(auVar50,auVar49);
              auVar44 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar50,auVar49,auVar44);
              auVar49 = vblendvps_avx(auVar49,auVar50,auVar44);
              auVar50 = vpcmpgtd_avx(auVar53,auVar56);
              auVar44 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar53,auVar56,auVar44);
              auVar53 = vblendvps_avx(auVar56,auVar53,auVar44);
              auVar56 = vpcmpgtd_avx(auVar61,auVar53);
              auVar44 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar61,auVar53,auVar44);
              auVar53 = vblendvps_avx(auVar53,auVar61,auVar44);
              *pauVar43 = auVar49;
              pauVar43[1] = auVar53;
              pauVar43[2] = auVar56;
              uVar37 = auVar50._0_8_;
              pauVar43 = pauVar43 + 3;
            }
            else {
              *pauVar43 = auVar49;
              pauVar43[1] = auVar53;
              pauVar43[2] = auVar50;
              pauVar36 = pauVar43 + 3;
              pauVar43[3] = auVar61;
              do {
                lVar38 = 0;
                for (uVar34 = uVar37; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar38 = lVar38 + 1;
                }
                auVar50._8_8_ = 0;
                auVar50._0_8_ = *(ulong *)(uVar39 + lVar38 * 8);
                auVar49 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_2700 + lVar38 * 4)));
                pauVar36[1] = auVar49;
                pauVar36 = pauVar36 + 1;
                uVar37 = uVar37 - 1 & uVar37;
              } while (uVar37 != 0);
              lVar38 = 0;
              while (pauVar36 != pauVar43) {
                auVar49 = pauVar43[1];
                uVar32 = vextractps_avx(auVar49,2);
                for (lVar40 = 0x10;
                    (lVar38 != lVar40 && (*(uint *)(pauVar43[-1] + lVar40 + 8) < uVar32));
                    lVar40 = lVar40 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar43 + lVar40) =
                       *(undefined1 (*) [16])(pauVar43[-1] + lVar40);
                }
                *(undefined1 (*) [16])(*pauVar43 + lVar40) = auVar49;
                lVar38 = lVar38 + -0x10;
                pauVar43 = pauVar43 + 1;
              }
              uVar37 = *(ulong *)*pauVar36;
              pauVar43 = pauVar36;
            }
          }
        }
      }
    }
    local_2840 = (ulong)((uint)uVar37 & 0xf) - 8;
    uVar37 = uVar37 & 0xfffffffffffffff0;
    for (local_2850 = 0; local_2850 != local_2840; local_2850 = local_2850 + 1) {
      lVar40 = local_2850 * 0x60;
      pSVar4 = context->scene;
      ppfVar5 = (pSVar4->vertices).items;
      pfVar6 = ppfVar5[*(uint *)(uVar37 + 0x40 + lVar40)];
      auVar54._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x20 + lVar40));
      auVar54._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + lVar40));
      pfVar7 = ppfVar5[*(uint *)(uVar37 + 0x48 + lVar40)];
      auVar58._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x28 + lVar40));
      auVar58._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 8 + lVar40));
      pfVar8 = ppfVar5[*(uint *)(uVar37 + 0x44 + lVar40)];
      auVar62._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x24 + lVar40));
      auVar62._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 4 + lVar40));
      pfVar9 = ppfVar5[*(uint *)(uVar37 + 0x4c + lVar40)];
      auVar73._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0x2c + lVar40));
      auVar73._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0xc + lVar40));
      lVar38 = uVar37 + 0x40 + lVar40;
      local_23c0 = *(undefined8 *)(lVar38 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar38 + 0x18);
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      lVar38 = uVar37 + 0x50 + lVar40;
      local_27c0 = *(undefined8 *)(lVar38 + 0x10);
      uStack_27b8 = *(undefined8 *)(lVar38 + 0x18);
      auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x10 + lVar40)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x18 + lVar40)));
      auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x10 + lVar40)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x18 + lVar40)));
      auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x14 + lVar40)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0x1c + lVar40)));
      auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x14 + lVar40)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0x1c + lVar40)));
      auVar61 = vunpcklps_avx(auVar49,auVar53);
      auVar44 = vunpcklps_avx(auVar56,auVar50);
      auVar49 = vunpckhps_avx(auVar56,auVar50);
      auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x30 + lVar40)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x38 + lVar40)));
      auVar53 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x30 + lVar40)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x38 + lVar40)));
      auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x34 + lVar40)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0x3c + lVar40)));
      auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x34 + lVar40)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 0x3c + lVar40)));
      auVar56 = vunpcklps_avx(auVar53,auVar56);
      auVar20 = vunpcklps_avx(auVar50,auVar19);
      auVar53 = vunpckhps_avx(auVar50,auVar19);
      uStack_27b0 = local_27c0;
      uStack_27a8 = uStack_27b8;
      auVar65 = vunpcklps_avx(auVar62,auVar73);
      auVar57 = vunpcklps_avx(auVar54,auVar58);
      auVar21 = vunpcklps_avx(auVar57,auVar65);
      auVar64 = vunpckhps_avx(auVar57,auVar65);
      auVar65 = vunpckhps_avx(auVar62,auVar73);
      auVar57 = vunpckhps_avx(auVar54,auVar58);
      auVar54 = vunpcklps_avx(auVar57,auVar65);
      auVar55._16_16_ = auVar44;
      auVar55._0_16_ = auVar44;
      auVar59._16_16_ = auVar49;
      auVar59._0_16_ = auVar49;
      auVar51._16_16_ = auVar61;
      auVar51._0_16_ = auVar61;
      auVar63._16_16_ = auVar20;
      auVar63._0_16_ = auVar20;
      auVar77._16_16_ = auVar53;
      auVar77._0_16_ = auVar53;
      auVar45._16_16_ = auVar56;
      auVar45._0_16_ = auVar56;
      auVar57 = vsubps_avx(auVar21,auVar55);
      auVar65 = vsubps_avx(auVar64,auVar59);
      auVar16 = vsubps_avx(auVar54,auVar51);
      auVar51 = vsubps_avx(auVar63,auVar21);
      auVar17 = vsubps_avx(auVar77,auVar64);
      auVar18 = vsubps_avx(auVar45,auVar54);
      auVar22._4_4_ = auVar65._4_4_ * auVar18._4_4_;
      auVar22._0_4_ = auVar65._0_4_ * auVar18._0_4_;
      auVar22._8_4_ = auVar65._8_4_ * auVar18._8_4_;
      auVar22._12_4_ = auVar65._12_4_ * auVar18._12_4_;
      auVar22._16_4_ = auVar65._16_4_ * auVar18._16_4_;
      auVar22._20_4_ = auVar65._20_4_ * auVar18._20_4_;
      auVar22._24_4_ = auVar65._24_4_ * auVar18._24_4_;
      auVar22._28_4_ = auVar56._12_4_;
      auVar50 = vfmsub231ps_fma(auVar22,auVar17,auVar16);
      uVar85 = *(undefined4 *)(ray + k * 4);
      auVar60._4_4_ = uVar85;
      auVar60._0_4_ = uVar85;
      auVar60._8_4_ = uVar85;
      auVar60._12_4_ = uVar85;
      auVar60._16_4_ = uVar85;
      auVar60._20_4_ = uVar85;
      auVar60._24_4_ = uVar85;
      auVar60._28_4_ = uVar85;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar86._4_4_ = uVar85;
      auVar86._0_4_ = uVar85;
      auVar86._8_4_ = uVar85;
      auVar86._12_4_ = uVar85;
      auVar86._16_4_ = uVar85;
      auVar86._20_4_ = uVar85;
      auVar86._24_4_ = uVar85;
      auVar86._28_4_ = uVar85;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar88._4_4_ = uVar85;
      auVar88._0_4_ = uVar85;
      auVar88._8_4_ = uVar85;
      auVar88._12_4_ = uVar85;
      auVar88._16_4_ = uVar85;
      auVar88._20_4_ = uVar85;
      auVar88._24_4_ = uVar85;
      auVar88._28_4_ = uVar85;
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar78._4_4_ = fVar1;
      auVar78._0_4_ = fVar1;
      auVar78._8_4_ = fVar1;
      auVar78._12_4_ = fVar1;
      auVar78._16_4_ = fVar1;
      auVar78._20_4_ = fVar1;
      auVar78._24_4_ = fVar1;
      auVar78._28_4_ = fVar1;
      auVar23._4_4_ = auVar16._4_4_ * auVar51._4_4_;
      auVar23._0_4_ = auVar16._0_4_ * auVar51._0_4_;
      auVar23._8_4_ = auVar16._8_4_ * auVar51._8_4_;
      auVar23._12_4_ = auVar16._12_4_ * auVar51._12_4_;
      auVar23._16_4_ = auVar16._16_4_ * auVar51._16_4_;
      auVar23._20_4_ = auVar16._20_4_ * auVar51._20_4_;
      auVar23._24_4_ = auVar16._24_4_ * auVar51._24_4_;
      auVar23._28_4_ = auVar61._12_4_;
      auVar21 = vsubps_avx(auVar21,auVar60);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar82._4_4_ = fVar2;
      auVar82._0_4_ = fVar2;
      auVar82._8_4_ = fVar2;
      auVar82._12_4_ = fVar2;
      auVar82._16_4_ = fVar2;
      auVar82._20_4_ = fVar2;
      auVar82._24_4_ = fVar2;
      auVar82._28_4_ = fVar2;
      auVar61 = vfmsub231ps_fma(auVar23,auVar18,auVar57);
      auVar64 = vsubps_avx(auVar64,auVar86);
      fVar67 = *(float *)(ray + k * 4 + 0x60);
      auVar87._4_4_ = fVar67;
      auVar87._0_4_ = fVar67;
      auVar87._8_4_ = fVar67;
      auVar87._12_4_ = fVar67;
      auVar87._16_4_ = fVar67;
      auVar87._20_4_ = fVar67;
      auVar87._24_4_ = fVar67;
      auVar87._28_4_ = fVar67;
      auVar54 = vsubps_avx(auVar54,auVar88);
      auVar24._4_4_ = fVar1 * auVar64._4_4_;
      auVar24._0_4_ = fVar1 * auVar64._0_4_;
      auVar24._8_4_ = fVar1 * auVar64._8_4_;
      auVar24._12_4_ = fVar1 * auVar64._12_4_;
      auVar24._16_4_ = fVar1 * auVar64._16_4_;
      auVar24._20_4_ = fVar1 * auVar64._20_4_;
      auVar24._24_4_ = fVar1 * auVar64._24_4_;
      auVar24._28_4_ = uVar85;
      auVar49 = vfmsub231ps_fma(auVar24,auVar21,auVar82);
      auVar25._4_4_ = auVar18._4_4_ * auVar49._4_4_;
      auVar25._0_4_ = auVar18._0_4_ * auVar49._0_4_;
      auVar25._8_4_ = auVar18._8_4_ * auVar49._8_4_;
      auVar25._12_4_ = auVar18._12_4_ * auVar49._12_4_;
      auVar25._16_4_ = auVar18._16_4_ * 0.0;
      auVar25._20_4_ = auVar18._20_4_ * 0.0;
      auVar25._24_4_ = auVar18._24_4_ * 0.0;
      auVar25._28_4_ = auVar18._28_4_;
      auVar89._0_4_ = auVar16._0_4_ * auVar49._0_4_;
      auVar89._4_4_ = auVar16._4_4_ * auVar49._4_4_;
      auVar89._8_4_ = auVar16._8_4_ * auVar49._8_4_;
      auVar89._12_4_ = auVar16._12_4_ * auVar49._12_4_;
      auVar89._16_4_ = auVar16._16_4_ * 0.0;
      auVar89._20_4_ = auVar16._20_4_ * 0.0;
      auVar89._24_4_ = auVar16._24_4_ * 0.0;
      auVar89._28_4_ = 0;
      auVar18._4_4_ = fVar67 * auVar21._4_4_;
      auVar18._0_4_ = fVar67 * auVar21._0_4_;
      auVar18._8_4_ = fVar67 * auVar21._8_4_;
      auVar18._12_4_ = fVar67 * auVar21._12_4_;
      auVar18._16_4_ = fVar67 * auVar21._16_4_;
      auVar18._20_4_ = fVar67 * auVar21._20_4_;
      auVar18._24_4_ = fVar67 * auVar21._24_4_;
      auVar18._28_4_ = auVar16._28_4_;
      auVar53 = vfmsub231ps_fma(auVar18,auVar54,auVar78);
      auVar49 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar53),auVar17);
      auVar53 = vfmadd231ps_fma(auVar89,auVar65,ZEXT1632(auVar53));
      auVar16._4_4_ = auVar57._4_4_ * auVar17._4_4_;
      auVar16._0_4_ = auVar57._0_4_ * auVar17._0_4_;
      auVar16._8_4_ = auVar57._8_4_ * auVar17._8_4_;
      auVar16._12_4_ = auVar57._12_4_ * auVar17._12_4_;
      auVar16._16_4_ = auVar57._16_4_ * auVar17._16_4_;
      auVar16._20_4_ = auVar57._20_4_ * auVar17._20_4_;
      auVar16._24_4_ = auVar57._24_4_ * auVar17._24_4_;
      auVar16._28_4_ = auVar17._28_4_;
      auVar44 = vfmsub231ps_fma(auVar16,auVar51,auVar65);
      auVar17._4_4_ = fVar2 * auVar54._4_4_;
      auVar17._0_4_ = fVar2 * auVar54._0_4_;
      auVar17._8_4_ = fVar2 * auVar54._8_4_;
      auVar17._12_4_ = fVar2 * auVar54._12_4_;
      auVar17._16_4_ = fVar2 * auVar54._16_4_;
      auVar17._20_4_ = fVar2 * auVar54._20_4_;
      auVar17._24_4_ = fVar2 * auVar54._24_4_;
      auVar17._28_4_ = auVar65._28_4_;
      auVar19 = vfmsub231ps_fma(auVar17,auVar64,auVar87);
      fVar1 = auVar44._0_4_;
      fVar2 = auVar44._4_4_;
      auVar26._4_4_ = fVar67 * fVar2;
      auVar26._0_4_ = fVar67 * fVar1;
      fVar11 = auVar44._8_4_;
      auVar26._8_4_ = fVar67 * fVar11;
      fVar12 = auVar44._12_4_;
      auVar26._12_4_ = fVar67 * fVar12;
      auVar26._16_4_ = fVar67 * 0.0;
      auVar26._20_4_ = fVar67 * 0.0;
      auVar26._24_4_ = fVar67 * 0.0;
      auVar26._28_4_ = fVar67;
      auVar56 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar61),auVar82);
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar50),auVar78);
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),ZEXT1632(auVar19),auVar51);
      auVar65 = vandps_avx(ZEXT1632(auVar56),local_2420);
      uVar32 = auVar65._0_4_;
      local_2700._0_4_ = (float)(uVar32 ^ auVar49._0_4_);
      uVar33 = auVar65._4_4_;
      local_2700._4_4_ = (float)(uVar33 ^ auVar49._4_4_);
      uVar75 = auVar65._8_4_;
      local_2700._8_4_ = (float)(uVar75 ^ auVar49._8_4_);
      uVar76 = auVar65._12_4_;
      local_2700._12_4_ = (float)(uVar76 ^ auVar49._12_4_);
      local_26c0._16_4_ = auVar65._16_4_;
      local_2700._16_4_ = local_26c0._16_4_;
      local_26c0._20_4_ = auVar65._20_4_;
      local_2700._20_4_ = local_26c0._20_4_;
      local_26c0._24_4_ = auVar65._24_4_;
      local_2700._24_4_ = local_26c0._24_4_;
      local_26c0._28_4_ = auVar65._28_4_;
      local_2700._28_4_ = local_26c0._28_4_;
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar57,ZEXT1632(auVar19));
      local_26e0._0_4_ = (float)(uVar32 ^ auVar49._0_4_);
      local_26e0._4_4_ = (float)(uVar33 ^ auVar49._4_4_);
      local_26e0._8_4_ = (float)(uVar75 ^ auVar49._8_4_);
      local_26e0._12_4_ = (float)(uVar76 ^ auVar49._12_4_);
      local_26e0._16_4_ = local_26c0._16_4_;
      local_26e0._20_4_ = local_26c0._20_4_;
      local_26e0._24_4_ = local_26c0._24_4_;
      local_26e0._28_4_ = local_26c0._28_4_;
      auVar65 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
      auVar57 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
      auVar65 = vandps_avx(auVar65,auVar57);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar68._16_4_ = 0x7fffffff;
      auVar68._20_4_ = 0x7fffffff;
      auVar68._24_4_ = 0x7fffffff;
      auVar68._28_4_ = 0x7fffffff;
      local_26a0 = vandps_avx(ZEXT1632(auVar56),auVar68);
      auVar57 = vcmpps_avx(ZEXT1632(auVar56),ZEXT832(0) << 0x20,4);
      auVar65 = vandps_avx(auVar65,auVar57);
      auVar80._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
      auVar80._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
      auVar80._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
      auVar80._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
      auVar80._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
      auVar80._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
      auVar80._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
      auVar80._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
      auVar57 = vcmpps_avx(auVar80,local_26a0,2);
      auVar16 = auVar57 & auVar65;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar65 = vandps_avx(auVar65,auVar57);
        auVar49 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        auVar27._4_4_ = fVar2 * auVar54._4_4_;
        auVar27._0_4_ = fVar1 * auVar54._0_4_;
        auVar27._8_4_ = fVar11 * auVar54._8_4_;
        auVar27._12_4_ = fVar12 * auVar54._12_4_;
        auVar27._16_4_ = auVar54._16_4_ * 0.0;
        auVar27._20_4_ = auVar54._20_4_ * 0.0;
        auVar27._24_4_ = auVar54._24_4_ * 0.0;
        auVar27._28_4_ = auVar54._28_4_;
        auVar53 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar61),auVar27);
        auVar53 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar50),ZEXT1632(auVar53));
        local_26c0._0_4_ = (float)(uVar32 ^ auVar53._0_4_);
        local_26c0._4_4_ = (float)(uVar33 ^ auVar53._4_4_);
        local_26c0._8_4_ = (float)(uVar75 ^ auVar53._8_4_);
        local_26c0._12_4_ = (float)(uVar76 ^ auVar53._12_4_);
        fVar67 = *(float *)(ray + k * 4 + 0x30);
        auVar21._4_4_ = local_26a0._4_4_ * fVar67;
        auVar21._0_4_ = local_26a0._0_4_ * fVar67;
        auVar21._8_4_ = local_26a0._8_4_ * fVar67;
        auVar21._12_4_ = local_26a0._12_4_ * fVar67;
        auVar21._16_4_ = local_26a0._16_4_ * fVar67;
        auVar21._20_4_ = local_26a0._20_4_ * fVar67;
        auVar21._24_4_ = local_26a0._24_4_ * fVar67;
        auVar21._28_4_ = fVar67;
        auVar65 = vcmpps_avx(auVar21,local_26c0,1);
        fVar67 = *(float *)(ray + k * 4 + 0x80);
        auVar48 = ZEXT3264(CONCAT428(fVar67,CONCAT424(fVar67,CONCAT420(fVar67,CONCAT416(fVar67,
                                                  CONCAT412(fVar67,CONCAT48(fVar67,CONCAT44(fVar67,
                                                  fVar67))))))));
        auVar64._0_4_ = local_26a0._0_4_ * fVar67;
        auVar64._4_4_ = local_26a0._4_4_ * fVar67;
        auVar64._8_4_ = local_26a0._8_4_ * fVar67;
        auVar64._12_4_ = local_26a0._12_4_ * fVar67;
        auVar64._16_4_ = local_26a0._16_4_ * fVar67;
        auVar64._20_4_ = local_26a0._20_4_ * fVar67;
        auVar64._24_4_ = local_26a0._24_4_ * fVar67;
        auVar64._28_4_ = 0;
        auVar57 = vcmpps_avx(local_26c0,auVar64,2);
        auVar65 = vandps_avx(auVar65,auVar57);
        auVar53 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        auVar49 = vpand_avx(auVar49,auVar53);
        auVar65 = vpmovzxwd_avx2(auVar49);
        auVar65 = vpslld_avx2(auVar65,0x1f);
        if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0x7f,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar65 >> 0xbf,0) != '\0') ||
            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar65[0x1f] < '\0') {
          local_2800 = vpsrad_avx2(auVar65,0x1f);
          local_2680 = ZEXT1632(auVar50);
          local_2660 = ZEXT1632(auVar61);
          local_2640 = ZEXT1632(auVar44);
          local_2620 = local_2800;
          local_2540 = local_24c0;
          auVar57 = vrcpps_avx(local_26a0);
          auVar83._8_4_ = 0x3f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._12_4_ = 0x3f800000;
          auVar83._16_4_ = 0x3f800000;
          auVar83._20_4_ = 0x3f800000;
          auVar83._24_4_ = 0x3f800000;
          auVar83._28_4_ = 0x3f800000;
          auVar53 = vfnmadd213ps_fma(local_26a0,auVar57,auVar83);
          auVar53 = vfmadd132ps_fma(ZEXT1632(auVar53),auVar57,auVar57);
          fVar67 = auVar53._0_4_;
          fVar70 = auVar53._4_4_;
          local_25c0._4_4_ = fVar70 * local_26c0._4_4_;
          local_25c0._0_4_ = fVar67 * local_26c0._0_4_;
          fVar71 = auVar53._8_4_;
          local_25c0._8_4_ = fVar71 * local_26c0._8_4_;
          fVar72 = auVar53._12_4_;
          local_25c0._12_4_ = fVar72 * local_26c0._12_4_;
          local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
          local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
          local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
          local_25c0._28_4_ = auVar57._28_4_;
          auVar66 = ZEXT3264(local_25c0);
          auVar28._4_4_ = fVar70 * local_2700._4_4_;
          auVar28._0_4_ = fVar67 * local_2700._0_4_;
          auVar28._8_4_ = fVar71 * local_2700._8_4_;
          auVar28._12_4_ = fVar72 * local_2700._12_4_;
          auVar28._16_4_ = local_26c0._16_4_ * 0.0;
          auVar28._20_4_ = local_26c0._20_4_ * 0.0;
          auVar28._24_4_ = local_26c0._24_4_ * 0.0;
          auVar28._28_4_ = local_26c0._28_4_;
          auVar57 = vminps_avx(auVar28,auVar83);
          auVar29._4_4_ = fVar70 * local_26e0._4_4_;
          auVar29._0_4_ = fVar67 * local_26e0._0_4_;
          auVar29._8_4_ = fVar71 * local_26e0._8_4_;
          auVar29._12_4_ = fVar72 * local_26e0._12_4_;
          auVar29._16_4_ = local_26c0._16_4_ * 0.0;
          auVar29._20_4_ = local_26c0._20_4_ * 0.0;
          auVar29._24_4_ = local_26c0._24_4_ * 0.0;
          auVar29._28_4_ = local_26c0._28_4_;
          auVar16 = vminps_avx(auVar29,auVar83);
          auVar51 = vsubps_avx(auVar83,auVar57);
          auVar17 = vsubps_avx(auVar83,auVar16);
          local_25e0 = vblendvps_avx(auVar16,auVar51,local_24c0);
          local_2600 = vblendvps_avx(auVar57,auVar17,local_24c0);
          fVar67 = local_24e0._0_4_;
          local_25a0._0_4_ = auVar50._0_4_ * fVar67;
          fVar70 = local_24e0._4_4_;
          local_25a0._4_4_ = auVar50._4_4_ * fVar70;
          fVar71 = local_24e0._8_4_;
          local_25a0._8_4_ = auVar50._8_4_ * fVar71;
          fVar72 = local_24e0._12_4_;
          local_25a0._12_4_ = auVar50._12_4_ * fVar72;
          fVar13 = local_24e0._16_4_;
          local_25a0._16_4_ = fVar13 * 0.0;
          fVar14 = local_24e0._20_4_;
          local_25a0._20_4_ = fVar14 * 0.0;
          fVar15 = local_24e0._24_4_;
          local_25a0._24_4_ = fVar15 * 0.0;
          local_25a0._28_4_ = 0;
          local_2580._0_4_ = fVar67 * auVar61._0_4_;
          local_2580._4_4_ = fVar70 * auVar61._4_4_;
          local_2580._8_4_ = fVar71 * auVar61._8_4_;
          local_2580._12_4_ = fVar72 * auVar61._12_4_;
          local_2580._16_4_ = fVar13 * 0.0;
          local_2580._20_4_ = fVar14 * 0.0;
          local_2580._24_4_ = fVar15 * 0.0;
          local_2580._28_4_ = 0;
          local_2560._0_4_ = fVar67 * fVar1;
          local_2560._4_4_ = fVar70 * fVar2;
          local_2560._8_4_ = fVar71 * fVar11;
          local_2560._12_4_ = fVar72 * fVar12;
          local_2560._16_4_ = fVar13 * 0.0;
          local_2560._20_4_ = fVar14 * 0.0;
          local_2560._24_4_ = fVar15 * 0.0;
          local_2560._28_4_ = 0;
          auVar46._8_4_ = 0x7f800000;
          auVar46._0_8_ = 0x7f8000007f800000;
          auVar46._12_4_ = 0x7f800000;
          auVar46._16_4_ = 0x7f800000;
          auVar46._20_4_ = 0x7f800000;
          auVar46._24_4_ = 0x7f800000;
          auVar46._28_4_ = 0x7f800000;
          auVar65 = vblendvps_avx(auVar46,local_25c0,auVar65);
          auVar57 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar57 = vminps_avx(auVar65,auVar57);
          auVar16 = vshufpd_avx(auVar57,auVar57,5);
          auVar57 = vminps_avx(auVar57,auVar16);
          auVar16 = vpermpd_avx2(auVar57,0x4e);
          auVar57 = vminps_avx(auVar57,auVar16);
          auVar65 = vcmpps_avx(auVar65,auVar57,0);
          auVar53 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
          auVar49 = vpand_avx(auVar53,auVar49);
          auVar65 = vpmovzxwd_avx2(auVar49);
          auVar65 = vpslld_avx2(auVar65,0x1f);
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar65 >> 0x7f,0) == '\0') &&
                (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar65 >> 0xbf,0) == '\0') &&
              (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar65[0x1f]) {
            auVar65 = local_2800;
          }
          uVar33 = vmovmskps_avx(auVar65);
          uVar32 = 0;
          for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
            uVar32 = uVar32 + 1;
          }
          do {
            local_2860 = (ulong)uVar32;
            uVar32 = *(uint *)((long)&local_23c0 + local_2860 * 4);
            local_2868 = (pSVar4->geometries).items[uVar32].ptr;
            if ((local_2868->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2800 + local_2860 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_2868->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar85 = *(undefined4 *)(local_2600 + local_2860 * 4);
                uVar3 = *(undefined4 *)(local_25e0 + local_2860 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + local_2860 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25a0 + local_2860 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + local_2860 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2560 + local_2860 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar85;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_27c0 + local_2860 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar32;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_2520 = auVar66._0_32_;
              local_27e0 = auVar48._0_32_;
              local_2500 = auVar90._0_32_;
              uVar85 = *(undefined4 *)(local_2600 + local_2860 * 4);
              local_2760._4_4_ = uVar85;
              local_2760._0_4_ = uVar85;
              local_2760._8_4_ = uVar85;
              local_2760._12_4_ = uVar85;
              local_2750 = *(undefined4 *)(local_25e0 + local_2860 * 4);
              local_2730._4_4_ = uVar32;
              local_2730._0_4_ = uVar32;
              local_2730._8_4_ = uVar32;
              local_2730._12_4_ = uVar32;
              uVar85 = *(undefined4 *)((long)&local_27c0 + local_2860 * 4);
              local_2740._4_4_ = uVar85;
              local_2740._0_4_ = uVar85;
              local_2740._8_4_ = uVar85;
              local_2740._12_4_ = uVar85;
              uVar85 = *(undefined4 *)(local_25a0 + local_2860 * 4);
              uVar3 = *(undefined4 *)(local_2580 + local_2860 * 4);
              local_2780._4_4_ = uVar3;
              local_2780._0_4_ = uVar3;
              local_2780._8_4_ = uVar3;
              local_2780._12_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_2560 + local_2860 * 4);
              local_2770._4_4_ = uVar3;
              local_2770._0_4_ = uVar3;
              local_2770._8_4_ = uVar3;
              local_2770._12_4_ = uVar3;
              local_2790[0] = (RTCHitN)(char)uVar85;
              local_2790[1] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2790[2] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2790[3] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2790[4] = (RTCHitN)(char)uVar85;
              local_2790[5] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2790[6] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2790[7] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2790[8] = (RTCHitN)(char)uVar85;
              local_2790[9] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2790[10] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2790[0xb] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2790[0xc] = (RTCHitN)(char)uVar85;
              local_2790[0xd] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2790[0xe] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2790[0xf] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              uStack_274c = local_2750;
              uStack_2748 = local_2750;
              uStack_2744 = local_2750;
              vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
              uStack_271c = context->user->instID[0];
              local_2720 = uStack_271c;
              uStack_2718 = uStack_271c;
              uStack_2714 = uStack_271c;
              uStack_2710 = context->user->instPrimID[0];
              uStack_270c = uStack_2710;
              uStack_2708 = uStack_2710;
              uStack_2704 = uStack_2710;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + local_2860 * 4);
              local_2880 = *local_2848;
              local_2830.valid = (int *)local_2880;
              local_2830.geometryUserPtr = local_2868->userPtr;
              local_2830.context = context->user;
              local_2830.hit = local_2790;
              local_2830.N = 4;
              local_2830.ray = (RTCRayN *)ray;
              if (local_2868->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_2868->intersectionFilterN)(&local_2830);
              }
              if (local_2880 == (undefined1  [16])0x0) {
                auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar49 = auVar49 ^ _DAT_01f46b70;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_2868->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var10)(&local_2830);
                }
                auVar53 = vpcmpeqd_avx(local_2880,_DAT_01f45a50);
                auVar49 = auVar53 ^ _DAT_01f46b70;
                if (local_2880 != (undefined1  [16])0x0) {
                  auVar53 = auVar53 ^ _DAT_01f46b70;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])local_2830.hit);
                  *(undefined1 (*) [16])(local_2830.ray + 0xc0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x10));
                  *(undefined1 (*) [16])(local_2830.ray + 0xd0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x20));
                  *(undefined1 (*) [16])(local_2830.ray + 0xe0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x30));
                  *(undefined1 (*) [16])(local_2830.ray + 0xf0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x40));
                  *(undefined1 (*) [16])(local_2830.ray + 0x100) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x50));
                  *(undefined1 (*) [16])(local_2830.ray + 0x110) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x60));
                  *(undefined1 (*) [16])(local_2830.ray + 0x120) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x70));
                  *(undefined1 (*) [16])(local_2830.ray + 0x130) = auVar56;
                  auVar53 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(local_2830.hit + 0x80));
                  *(undefined1 (*) [16])(local_2830.ray + 0x140) = auVar53;
                }
              }
              auVar44._8_8_ = 0x100000001;
              auVar44._0_8_ = 0x100000001;
              if ((auVar44 & auVar49) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_27e0._0_4_;
              }
              else {
                local_27e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_2800 + local_2860 * 4) = 0;
              auVar48 = ZEXT3264(local_27e0);
              uVar85 = local_27e0._0_4_;
              auVar47._4_4_ = uVar85;
              auVar47._0_4_ = uVar85;
              auVar47._8_4_ = uVar85;
              auVar47._12_4_ = uVar85;
              auVar47._16_4_ = uVar85;
              auVar47._20_4_ = uVar85;
              auVar47._24_4_ = uVar85;
              auVar47._28_4_ = uVar85;
              auVar66 = ZEXT3264(local_2520);
              auVar65 = vcmpps_avx(local_2520,auVar47,2);
              local_2800 = vandps_avx(auVar65,local_2800);
              auVar90 = ZEXT3264(local_2500);
            }
            if ((((((((local_2800 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2800 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2800 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2800 >> 0x7f,0) == '\0') &&
                  (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2800 >> 0xbf,0) == '\0') &&
                (local_2800 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2800[0x1f]) break;
            auVar52._8_4_ = 0x7f800000;
            auVar52._0_8_ = 0x7f8000007f800000;
            auVar52._12_4_ = 0x7f800000;
            auVar52._16_4_ = 0x7f800000;
            auVar52._20_4_ = 0x7f800000;
            auVar52._24_4_ = 0x7f800000;
            auVar52._28_4_ = 0x7f800000;
            auVar65 = vblendvps_avx(auVar52,auVar66._0_32_,local_2800);
            auVar57 = vshufps_avx(auVar65,auVar65,0xb1);
            auVar57 = vminps_avx(auVar65,auVar57);
            auVar16 = vshufpd_avx(auVar57,auVar57,5);
            auVar57 = vminps_avx(auVar57,auVar16);
            auVar16 = vpermpd_avx2(auVar57,0x4e);
            auVar57 = vminps_avx(auVar57,auVar16);
            auVar57 = vcmpps_avx(auVar65,auVar57,0);
            auVar16 = local_2800 & auVar57;
            auVar65 = local_2800;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar65 = vandps_avx(auVar57,local_2800);
            }
            uVar33 = vmovmskps_avx(auVar65);
            uVar32 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
              uVar32 = uVar32 + 1;
            }
          } while( true );
        }
      }
      auVar66 = ZEXT3264(local_23e0);
      auVar69 = ZEXT3264(local_2400);
      auVar74 = ZEXT3264(local_2440);
      auVar79 = ZEXT3264(local_2460);
      auVar81 = ZEXT3264(local_2480);
      auVar84 = ZEXT3264(local_24a0);
    }
    uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar48 = ZEXT3264(CONCAT428(uVar85,CONCAT424(uVar85,CONCAT420(uVar85,CONCAT416(uVar85,CONCAT412
                                                  (uVar85,CONCAT48(uVar85,CONCAT44(uVar85,uVar85))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }